

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

void __thiscall
nonsugar::detail::parse_argument<std::__cxx11::string,std::__cxx11::string,void>::operator()
          (parse_argument<std::__cxx11::string,std::__cxx11::string,void> *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              last,shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *value,
          argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *arg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  undefined1 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  _Manager_type p_Var5;
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar6;
  pointer pcVar7;
  long *unaff_R12;
  undefined1 *unaff_R13;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Any_data local_90;
  _Manager_type local_80;
  _Invoker_type local_78;
  long local_70;
  long lStack_68;
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  if (it->_M_current == last._M_current) {
    local_e0 = &local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"argument required: ","");
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e0,(ulong)(arg->placeholder)._M_dataplus._M_p);
    p_Var5 = (_Manager_type)(plVar2 + 2);
    if ((_Manager_type)*plVar2 == p_Var5) {
      local_70 = *(long *)p_Var5;
      lStack_68 = plVar2[3];
      local_80 = (_Manager_type)&local_70;
    }
    else {
      local_70 = *(long *)p_Var5;
      local_80 = (_Manager_type)*plVar2;
    }
    local_78 = (_Invoker_type)plVar2[1];
    *plVar2 = (long)p_Var5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_80);
    if (local_80 != (_Manager_type)&local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_e0 == &local_d0) {
      return;
    }
    operator_delete(local_e0,local_d0 + 1);
    return;
  }
  if ((arg->read).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar4 = std::__throw_bad_function_call();
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if ((undefined1 *)local_a0._M_allocated_capacity != unaff_R13) {
      operator_delete((void *)local_a0._M_allocated_capacity,
                      (ulong)(local_90._M_unused._M_member_pointer + 1));
    }
    if (local_c0 != arg) {
      operator_delete(local_c0,(ulong)(local_b0._0_8_ + 1));
    }
    if (local_50[0] != unaff_R12) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
    _Unwind_Resume(uVar4);
  }
  (*(arg->read)._M_invoker)
            ((_Any_data *)local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg->read);
  if ((element_type *)local_60._0_8_ != (element_type *)0x0) {
    it->_M_current = it->_M_current + 1;
    (value->
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = (element_type *)local_60._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(value->
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    goto LAB_0012e474;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"invalid argument: ","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_50,(ulong)(arg->placeholder)._M_dataplus._M_p);
  paVar6 = (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(plVar2 + 2);
  if ((argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)*plVar2 == paVar6) {
    local_b0._0_8_ = (paVar6->placeholder)._M_dataplus._M_p;
    local_b0._8_4_ = (undefined4)plVar2[3];
    local_b0._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
    local_c0 = (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b0;
  }
  else {
    local_b0._0_8_ = (paVar6->placeholder)._M_dataplus._M_p;
    local_c0 = (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)*plVar2;
  }
  local_b8 = plVar2[1];
  *plVar2 = (long)paVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  puVar1 = local_b0 + 0x20;
  local_a0._M_allocated_capacity = (size_type)puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b0 + 0x10),"=","");
  pcVar7 = (pointer)0xf;
  if (local_c0 !=
      (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_b0) {
    pcVar7 = (pointer)local_b0._0_8_;
  }
  if (pcVar7 < (pointer)(local_a0._8_8_ + local_b8)) {
    uVar4 = (pointer)0xf;
    if ((undefined1 *)local_a0._M_allocated_capacity != puVar1) {
      uVar4 = local_90._M_unused._0_8_;
    }
    if ((ulong)uVar4 < (pointer)(local_a0._8_8_ + local_b8)) goto LAB_0012e32a;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)(local_b0 + 0x10),0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_0012e32a:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_c0,local_a0._M_allocated_capacity);
  }
  local_e0 = &local_d0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_d0 = *plVar2;
    uStack_c8 = puVar3[3];
  }
  else {
    local_d0 = *plVar2;
    local_e0 = (long *)*puVar3;
  }
  local_d8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)(it->_M_current->_M_dataplus)._M_p);
  p_Var5 = (_Manager_type)(plVar2 + 2);
  if ((_Manager_type)*plVar2 == p_Var5) {
    local_70 = *(long *)p_Var5;
    lStack_68 = plVar2[3];
    local_80 = (_Manager_type)&local_70;
  }
  else {
    local_70 = *(long *)p_Var5;
    local_80 = (_Manager_type)*plVar2;
  }
  local_78 = (_Invoker_type)plVar2[1];
  *plVar2 = (long)p_Var5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)err,(string *)&local_80);
  if (local_80 != (_Manager_type)&local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((undefined1 *)local_a0._M_allocated_capacity != puVar1) {
    operator_delete((void *)local_a0._M_allocated_capacity,
                    (ulong)(local_90._M_unused._M_member_pointer + 1));
  }
  if (local_c0 !=
      (argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_b0) {
    operator_delete(local_c0,(ulong)(local_b0._0_8_ + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
LAB_0012e474:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  return;
}

Assistant:

void operator()(
        Iterator &it, Iterator last, std::shared_ptr<Value> &value, Argument const &arg,
        String &err) const
    {
        if (it == last) {
            err = widen<String>("argument required: ") + arg.placeholder;
            return;
        }
        auto const v = arg.read(*it);
        if (!v) {
            err = widen<String>("invalid argument: ") + arg.placeholder + widen<String>("=") + *it;
            return;
        }
        ++it;
        value = v;
    }